

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O0

int qt_create_pipe(int *pipe)

{
  int iVar1;
  int *var;
  int *in_RDI;
  long in_FS_OFFSET;
  int pipe_ret;
  QScopedValueRollback<int> rollback;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI != -1) {
    qt_safe_close(in_stack_ffffffffffffffc4);
  }
  if (in_RDI[1] != -1) {
    qt_safe_close(in_stack_ffffffffffffffc4);
  }
  iVar1 = qt_safe_pipe((int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
  if (iVar1 != 0) {
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    var = __errno_location();
    QScopedValueRollback<int>::QScopedValueRollback((QScopedValueRollback<int> *)local_18,var);
    qErrnoWarning("QProcess: Cannot create pipe");
    QScopedValueRollback<int>::~QScopedValueRollback((QScopedValueRollback<int> *)local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int qt_create_pipe(int *pipe)
{
    if (pipe[0] != -1)
        qt_safe_close(pipe[0]);
    if (pipe[1] != -1)
        qt_safe_close(pipe[1]);
    int pipe_ret = qt_safe_pipe(pipe);
    if (pipe_ret != 0) {
        QScopedValueRollback rollback(errno);
        qErrnoWarning("QProcess: Cannot create pipe");
    }
    return pipe_ret;
}